

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

parameter * clipp::option<char_const(&)[8]>(char (*flag) [8])

{
  parameter *ppVar1;
  parameter *in_RSI;
  parameter *in_RDI;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 uVar2;
  parameter *this;
  allocator<char> local_131;
  string local_130 [88];
  arg_string *in_stack_ffffffffffffff28;
  parameter *in_stack_ffffffffffffff30;
  
  this = (parameter *)&local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,(char *)in_RSI,(allocator *)this);
  parameter::parameter<>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  uVar2 = 0;
  ppVar1 = parameter::required((parameter *)(local_130 + 0x20),false);
  ppVar1 = detail::token<clipp::parameter>::blocking
                     (&ppVar1->super_token<clipp::parameter>,SUB41(uVar2,0));
  detail::token<clipp::parameter>::repeatable(&ppVar1->super_token<clipp::parameter>,SUB41(uVar2,0))
  ;
  parameter::parameter(this,in_RSI);
  parameter::~parameter((parameter *)CONCAT44(uVar2,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  return in_RDI;
}

Assistant:

inline parameter
option(String&& flag, Strings&&... flags)
{
    return parameter{std::forward<String>(flag), std::forward<Strings>(flags)...}
        .required(false).blocking(false).repeatable(false);
}